

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode setstropt_userpwd(char *option,char **userp,char **passwdp)

{
  CURLcode CVar1;
  size_t len;
  char *pcVar2;
  char **passwdp_00;
  char **userp_00;
  CURLcode CVar3;
  char *user;
  char *passwd;
  char *local_30;
  char *local_28;
  
  CVar3 = CURLE_OK;
  local_30 = (char *)0x0;
  local_28 = (char *)0x0;
  if (option != (char *)0x0) {
    len = strlen(option);
    userp_00 = &local_30;
    if (userp == (char **)0x0) {
      userp_00 = (char **)0x0;
    }
    passwdp_00 = &local_28;
    if (passwdp == (char **)0x0) {
      passwdp_00 = (char **)0x0;
    }
    CVar1 = parse_login_details(option,len,userp_00,passwdp_00,(char **)0x0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  if (userp != (char **)0x0) {
    CVar3 = CURLE_OK;
    pcVar2 = local_30;
    if (local_30 == (char *)0x0 && option != (char *)0x0) {
      if (*option == ':') {
        pcVar2 = (*Curl_cstrdup)("");
        CVar3 = CURLE_OUT_OF_MEMORY;
        local_30 = pcVar2;
        if (pcVar2 != (char *)0x0) {
          CVar3 = CURLE_OK;
        }
      }
      else {
        pcVar2 = (char *)0x0;
        CVar3 = CURLE_OK;
      }
    }
    if (*userp != (char *)0x0) {
      (*Curl_cfree)(*userp);
      pcVar2 = local_30;
    }
    *userp = pcVar2;
  }
  if (passwdp != (char **)0x0) {
    if (*passwdp != (char *)0x0) {
      (*Curl_cfree)(*passwdp);
    }
    *passwdp = local_28;
  }
  return CVar3;
}

Assistant:

static CURLcode setstropt_userpwd(char *option, char **userp, char **passwdp)
{
  CURLcode result = CURLE_OK;
  char *user = NULL;
  char *passwd = NULL;

  /* Parse the login details if specified. It not then we treat NULL as a hint
     to clear the existing data */
  if(option) {
    result = parse_login_details(option, strlen(option),
                                 (userp ? &user : NULL),
                                 (passwdp ? &passwd : NULL),
                                 NULL);
  }

  if(!result) {
    /* Store the username part of option if required */
    if(userp) {
      if(!user && option && option[0] == ':') {
        /* Allocate an empty string instead of returning NULL as user name */
        user = strdup("");
        if(!user)
          result = CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(*userp);
      *userp = user;
    }

    /* Store the password part of option if required */
    if(passwdp) {
      Curl_safefree(*passwdp);
      *passwdp = passwd;
    }
  }

  return result;
}